

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

TreeNode * si9ma::BinaryTree::generate_node(string *str)

{
  bool bVar1;
  int value;
  string *str_local;
  
  bVar1 = std::operator==("#",str);
  if (bVar1) {
    str_local = (string *)0x0;
  }
  else {
    str_local = (string *)operator_new(0x20);
    value = std::__cxx11::stoi(str,(size_t *)0x0,10);
    TreeNode::TreeNode((TreeNode *)str_local,value);
  }
  return (TreeNode *)str_local;
}

Assistant:

TreeNode* BinaryTree::generate_node(string str) {
        if ("#" == str)
            return nullptr;

        return new TreeNode(stoi(str));
    }